

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::SectionParser::parse(SectionParser *this,istream *input,ForceField *ff,int lineNo)

{
  bool bVar1;
  long *plVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  int in_ECX;
  undefined8 in_RDX;
  char *in_RSI;
  long *in_RDI;
  string filteredLine;
  string line;
  char buffer [65535];
  int bufferSize;
  locale *in_stack_fffffffffffefec0;
  string *in_stack_fffffffffffefec8;
  string *in_stack_fffffffffffefed0;
  SectionParser *this_00;
  string *in_stack_fffffffffffefee0;
  undefined7 in_stack_fffffffffffefee8;
  undefined1 in_stack_fffffffffffefeef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffefef0;
  string asStack_100e8 [32];
  undefined1 auStack_100c8 [16];
  string asStack_100b8 [32];
  SectionParser SStack_10098;
  string asStack_10068 [8];
  string *in_stack_fffffffffffeffa0;
  SectionParser *in_stack_fffffffffffeffa8;
  string asStack_10048 [32];
  undefined1 auStack_10028 [65548];
  int local_1c;
  
  std::__cxx11::string::string(asStack_10048);
  std::__cxx11::string::string(asStack_10068);
  local_1c = in_ECX;
  while( true ) {
    plVar2 = (long *)std::istream::getline(in_RSI,(long)auStack_10028);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    local_1c = local_1c + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffefef0,
               (char *)CONCAT17(in_stack_fffffffffffefeef,in_stack_fffffffffffefee8),
               (allocator<char> *)in_stack_fffffffffffefee0);
    in_stack_fffffffffffefef0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_100c8;
    std::locale::locale((locale *)in_stack_fffffffffffefef0);
    Utils::trimLeftCopy(in_stack_fffffffffffefec8,in_stack_fffffffffffefec0);
    in_stack_fffffffffffefee0 = asStack_10048;
    this_00 = &SStack_10098;
    std::__cxx11::string::operator=(in_stack_fffffffffffefee0,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    std::locale::~locale((locale *)auStack_100c8);
    std::__cxx11::string::~string(asStack_100b8);
    std::allocator<char>::~allocator((allocator<char> *)(auStack_100c8 + 0xf));
    in_stack_fffffffffffefeef = isEndSection(in_stack_fffffffffffeffa8,in_stack_fffffffffffeffa0);
    if ((bool)in_stack_fffffffffffefeef) break;
    uVar3 = std::__cxx11::string::empty();
    if (((((uVar3 & 1) == 0) &&
         (((uVar3 = std::__cxx11::string::size(), uVar3 < 2 ||
           (in_stack_fffffffffffefed0 =
                 (string *)std::__cxx11::string::operator[]((ulong)asStack_10048),
           in_stack_fffffffffffefed0->_M_dataplus != (_Alloc_hider)0x2f)) ||
          (in_stack_fffffffffffefec8 =
                (string *)std::__cxx11::string::operator[]((ulong)asStack_10048),
          in_stack_fffffffffffefec8->_M_dataplus != (_Alloc_hider)0x2f)))) &&
        ((lVar4 = std::__cxx11::string::size(), lVar4 == 0 ||
         (in_stack_fffffffffffefec0 =
               (locale *)std::__cxx11::string::operator[]((ulong)asStack_10048),
         *in_stack_fffffffffffefec0 != (locale)0x23)))) &&
       ((lVar4 = std::__cxx11::string::size(), lVar4 == 0 ||
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)asStack_10048), *pcVar5 != '!'))))
    {
      stripComments(this_00,in_stack_fffffffffffefed0);
      std::__cxx11::string::operator=(asStack_10068,asStack_100e8);
      std::__cxx11::string::~string(asStack_100e8);
      (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX,asStack_10068,local_1c);
    }
  }
  std::__cxx11::string::~string(asStack_10068);
  std::__cxx11::string::~string(asStack_10048);
  return;
}

Assistant:

void SectionParser::parse(std::istream& input, ForceField& ff, int lineNo) {
    const int bufferSize = 65535;
    char buffer[bufferSize];
    std::string line, filteredLine;
    while (input.getline(buffer, bufferSize)) {
      ++lineNo;
      line = Utils::trimLeftCopy(buffer);
      // a line begins with "//" is comment
      // let's also call lines starting with # and ! as comments
      if (isEndSection(line)) {
        break;
      } else if (line.empty() ||
                 (line.size() >= 2 && line[0] == '/' && line[1] == '/') ||
                 (line.size() >= 1 && line[0] == '#') ||
                 (line.size() >= 1 && line[0] == '!')) {
        continue;
      } else {
        filteredLine = stripComments(line);
        parseLine(ff, filteredLine, lineNo);
      }
    }
  }